

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_NodeRef_rec(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int Counter;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  local_2c = 0;
  iVar1 = Gia_ObjIsCi(pNode);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pNode);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x445,"int Gia_NodeRef_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pNode);
    iVar1 = Gia_ObjRefInc(p,pGVar2);
    if (iVar1 == 0) {
      local_2c = Gia_NodeRef_rec(p,pGVar2);
    }
    pGVar2 = Gia_ObjFanin1(pNode);
    iVar1 = Gia_ObjRefInc(p,pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_NodeRef_rec(p,pGVar2);
      local_2c = iVar1 + local_2c;
    }
    p_local._4_4_ = local_2c + 1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_NodeRef_rec( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    pFanin = Gia_ObjFanin0(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin );
    pFanin = Gia_ObjFanin1(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin );
    return Counter + 1;
}